

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

void __thiscall
tchecker::parsing::attributes_t::insert
          (attributes_t *this,shared_ptr<tchecker::parsing::attr_t> *attr)

{
  __hashtable *__h;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>
  local_40;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>,_true>
            (&local_40,
             &((attr->super___shared_ptr<tchecker::parsing::attr_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_key,attr);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)this,0,&local_40);
  if (local_40.second.super___shared_ptr<tchecker::parsing::attr_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.second.
               super___shared_ptr<tchecker::parsing::attr_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != &local_40.first.field_2) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void attributes_t::insert(std::shared_ptr<tchecker::parsing::attr_t> const & attr) { _attr.insert({attr->key(), attr}); }